

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_show_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  ulong uVar1;
  REF_DBL *pRVar2;
  ulong uVar3;
  REF_DBL *local_48;
  
  if (0 < rows) {
    uVar1 = 0;
    local_48 = ab;
    do {
      if (0 < cols) {
        uVar3 = 0;
        pRVar2 = local_48;
        do {
          printf("%12.4e",*pRVar2);
          if ((long)uVar3 < (long)(cols + -1)) {
            putchar(0x20);
          }
          if (rows - 1 == uVar3) {
            printf("| ");
          }
          uVar3 = uVar3 + 1;
          pRVar2 = pRVar2 + (uint)rows;
        } while ((uint)cols != uVar3);
      }
      putchar(10);
      uVar1 = uVar1 + 1;
      local_48 = local_48 + 1;
    } while (uVar1 != (uint)rows);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_ab(REF_INT rows, REF_INT cols, REF_DBL *ab) {
  REF_INT row, col;

  for (row = 0; row < rows; row++) {
    for (col = 0; col < cols; col++) {
      printf("%12.4e", ab[row + rows * col]);
      if (col < cols - 1) printf(" ");
      if (col == rows - 1) printf("| ");
    }
    printf("\n");
  }
  return REF_SUCCESS;
}